

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-diy-fp.cc
# Opt level: O2

void TestSubtract(void)

{
  bool in_CL;
  undefined1 condition;
  int in_R9D;
  
  CheckHelper((char *)0x2b,0xc19b70,(char *)0x1,in_CL);
  condition = 0x7e;
  CheckEqualsHelper((char *)0x2c,0xc1672f,(char *)0x0,0xc19b7e,(char *)0x0,in_R9D);
  CheckHelper((char *)0x2e,0xc19b87,(char *)0x1,(bool)condition);
  CheckEqualsHelper((char *)0x2f,0xc1672f,(char *)0x0,0xc19b98,(char *)0x0,in_R9D);
  return;
}

Assistant:

TEST(Subtract) {
  DiyFp diy_fp1 = DiyFp(3, 0);
  DiyFp diy_fp2 = DiyFp(1, 0);
  DiyFp diff = DiyFp::Minus(diy_fp1, diy_fp2);

  CHECK(2 == diff.f());  // NOLINT
  CHECK_EQ(0, diff.e());
  diy_fp1.Subtract(diy_fp2);
  CHECK(2 == diy_fp1.f());  // NOLINT
  CHECK_EQ(0, diy_fp1.e());
}